

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O1

void __thiscall adios2::core::engine::CampaignManager::~CampaignManager(CampaignManager *this)

{
  pointer pcVar1;
  long lVar2;
  undefined8 uVar3;
  
  if (this->m_Opened == true) {
    Close(this);
  }
  pcVar1 = (this->m_CampaignDir)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_CampaignDir).field_2) {
    operator_delete(pcVar1);
  }
  uVar3 = _pthread_rwlock_init;
  lVar2 = _VTT;
  *(long *)&this->m_Output = _VTT;
  *(undefined8 *)(&this->m_Output + *(long *)(lVar2 + -0x18)) = uVar3;
  std::filebuf::~filebuf((filebuf *)&this->field_0xd8);
  std::ios_base::~ios_base((ios_base *)&this->field_0x1c8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::core::engine::CampaignRecord>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->cmap)._M_h);
  pcVar1 = (this->m_Name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Name).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_Options).cachepath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Options).cachepath.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_Options).campaignstorepath._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Options).campaignstorepath.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->m_Options).hostname._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_Options).hostname.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

CampaignManager::~CampaignManager()
{
    if (m_Opened)
    {
        Close();
    }
}